

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int write_dns_response_by_query(char *buffer,answer *answer,uint16_t answer_num)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  
  buffer[2] = -0x80;
  buffer[3] = '\0';
  *(uint16_t *)(buffer + 6) = answer_num << 8 | answer_num >> 8;
  pcVar4 = buffer + 0xc;
  cVar1 = buffer[0xc];
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + (long)cVar1 + 1;
    cVar1 = *pcVar4;
  }
  pcVar4 = pcVar4 + 5;
  if (answer_num != 0) {
    uVar3 = (ulong)answer_num;
    do {
      iVar2 = write_dns_answer(pcVar4,answer->name,(uint)answer->type,(uint)answer->class_,
                               answer->ttl,&answer->address);
      pcVar4 = pcVar4 + iVar2;
      answer = answer + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return (int)pcVar4 - (int)buffer;
}

Assistant:

int write_dns_response_by_query(char *buffer, struct answer answer[],
                                uint16_t answer_num) {
  struct dns_header *header;
  header = (struct dns_header *)buffer;
  header->flags = htons(FLAG_RESPONSE_NORMAL);
  header->ancount = htons(answer_num);
  char *data = skip_to_answer(buffer);
  for (int i = 0; i < answer_num; i++) {
    data +=
        write_dns_answer(data, answer[i].name, answer[i].type, answer[i].class_,
                         answer[i].ttl, &answer[i].address);
    //                                                                                    ^^^^^^^^^^^^^^^^^^
    //                                                                                  无论是cname还是address，开始地址都是相同的。
    //                                                                                  在write_dns_answer中，rdata会被确定为具体的类型
  }
  return data - buffer;
}